

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O3

bool __thiscall
draco::MeshAttributeCornerTable::RecomputeVerticesInternal<true>
          (MeshAttributeCornerTable *this,Mesh *mesh,PointAttribute *att)

{
  pointer pIVar1;
  iterator iVar2;
  long lVar3;
  iterator iVar4;
  uint uVar5;
  uint uVar6;
  pointer pIVar7;
  CornerTable *pCVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  CornerIndex first_c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_54;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_50;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_4c;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_48;
  vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
  *local_40;
  Mesh *local_38;
  
  pIVar1 = (this->vertex_to_attribute_entry_id_map_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertex_to_attribute_entry_id_map_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar1) {
    (this->vertex_to_attribute_entry_id_map_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar1;
  }
  pIVar7 = (this->vertex_to_left_most_corner_map_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertex_to_left_most_corner_map_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar7) {
    (this->vertex_to_left_most_corner_map_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar7;
  }
  pCVar8 = this->corner_table_;
  pIVar7 = (pCVar8->vertex_corners_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(pCVar8->vertex_corners_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar7) >> 2) != 0) {
    local_40 = (vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                *)&this->vertex_to_attribute_entry_id_map_;
    local_48 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)&this->vertex_to_left_most_corner_map_;
    uVar10 = 0;
    uVar12 = 0;
    local_38 = mesh;
    do {
      uVar6 = pIVar7[uVar10].value_;
      uVar13 = uVar12;
      if (uVar6 != 0xffffffff) {
        if ((int)uVar6 < 0) {
          local_50.value_ = 0xffffffff;
        }
        else {
          local_50.value_ =
               (local_38->faces_).vector_.
               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar6 / 3]._M_elems[uVar6 % 3].
               value_;
        }
        if (att->identity_mapping_ == false) {
          local_50.value_ =
               (att->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_50.value_].value_;
        }
        iVar2._M_current =
             (this->vertex_to_attribute_entry_id_map_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->vertex_to_attribute_entry_id_map_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
          ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>
                    (local_40,iVar2,&local_50);
        }
        else {
          (iVar2._M_current)->value_ = local_50.value_;
          (this->vertex_to_attribute_entry_id_map_).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_54.value_ = 0;
        if (((this->is_vertex_on_seam_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] >>
             (uVar10 & 0x3f) & 1) == 0) {
LAB_00148e20:
          uVar11 = (ulong)uVar6;
          local_50.value_ = uVar6;
        }
        else {
          uVar13 = uVar6 - 2;
          if (0x55555555 < (uVar6 + 1) * -0x55555555) {
            uVar13 = uVar6 + 1;
          }
          lVar3 = (long)(this->is_edge_on_seam_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          if (uVar13 == 0xffffffff) {
            pCVar8 = this->corner_table_;
            uVar9 = 0xffffffff;
          }
          else {
            pCVar8 = this->corner_table_;
            uVar9 = 0xffffffff;
            if (((*(ulong *)(lVar3 + (ulong)(uVar13 >> 6) * 8) >> ((ulong)uVar13 & 0x3f) & 1) == 0)
               && (uVar13 = (pCVar8->opposite_corners_).vector_.
                            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar13].value_,
                  uVar13 != 0xffffffff)) {
              uVar5 = uVar13 - 2;
              if (0x55555555 < (uVar13 + 1) * -0x55555555) {
                uVar5 = uVar13 + 1;
              }
              uVar9 = (ulong)uVar5;
            }
          }
          local_54.value_ = (uint)uVar9;
          if (local_54.value_ == 0xffffffff) goto LAB_00148e20;
          do {
            uVar11 = uVar9;
            local_50.value_ = (uint)uVar11;
            uVar13 = local_50.value_ - 2;
            if (0x55555555 < (local_50.value_ + 1) * -0x55555555) {
              uVar13 = local_50.value_ + 1;
            }
            uVar9 = 0xffffffff;
            if (((uVar13 != 0xffffffff) &&
                ((*(ulong *)(lVar3 + (ulong)(uVar13 >> 6) * 8) >> ((ulong)uVar13 & 0x3f) & 1) == 0))
               && (uVar13 = (pCVar8->opposite_corners_).vector_.
                            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar13].value_,
                  uVar13 != 0xffffffff)) {
              uVar5 = uVar13 - 2;
              if (0x55555555 < (uVar13 + 1) * -0x55555555) {
                uVar5 = uVar13 + 1;
              }
              uVar9 = (ulong)uVar5;
            }
            if ((uint)uVar9 == uVar6) {
              return false;
            }
          } while ((uint)uVar9 != 0xffffffff);
          local_54.value_ = 0xffffffff;
        }
        (this->corner_to_vertex_map_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar11].value_ = uVar12;
        iVar4._M_current =
             (this->vertex_to_left_most_corner_map_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->vertex_to_left_most_corner_map_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
          ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                    (local_48,iVar4,
                     (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&local_50);
        }
        else {
          (iVar4._M_current)->value_ = local_50.value_;
          (this->vertex_to_left_most_corner_map_).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        uVar13 = uVar12 + 1;
        pCVar8 = this->corner_table_;
        if (local_50.value_ != 0xffffffff) {
          if (local_50.value_ * -0x55555555 < 0x55555556) {
            uVar6 = local_50.value_ + 2;
            if (uVar6 == 0xffffffff) goto LAB_00149022;
          }
          else {
            uVar6 = local_50.value_ - 1;
          }
          uVar6 = (pCVar8->opposite_corners_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
          if ((uVar6 != 0xffffffff) &&
             (local_54.value_ = ((uVar6 * -0x55555555 < 0x55555556) - 1 | 2) + uVar6,
             local_54.value_ != local_50.value_ && local_54.value_ != 0xffffffff)) {
            while( true ) {
              uVar6 = local_54.value_ - 2;
              if (0x55555555 < (local_54.value_ + 1) * -0x55555555) {
                uVar6 = local_54.value_ + 1;
              }
              if ((*(ulong *)((long)(this->is_edge_on_seam_).
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + (ulong)(uVar6 >> 6) * 8) >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
                if ((int)local_54.value_ < 0) {
                  local_4c.value_ = 0xffffffff;
                }
                else {
                  local_4c.value_ =
                       (local_38->faces_).vector_.
                       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(ulong)local_54.value_ / 3].
                       _M_elems[local_54.value_ % 3].value_;
                }
                if (att->identity_mapping_ == false) {
                  local_4c.value_ =
                       (att->indices_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_4c.value_].value_;
                }
                iVar2._M_current =
                     (this->vertex_to_attribute_entry_id_map_).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (this->vertex_to_attribute_entry_id_map_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                  ::
                  _M_realloc_insert<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>
                            (local_40,iVar2,&local_4c);
                }
                else {
                  (iVar2._M_current)->value_ = local_4c.value_;
                  (this->vertex_to_attribute_entry_id_map_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                }
                iVar4._M_current =
                     (this->vertex_to_left_most_corner_map_).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                uVar12 = uVar13;
                if (iVar4._M_current ==
                    (this->vertex_to_left_most_corner_map_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  ::
                  _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                            (local_48,iVar4,&local_54);
                  uVar13 = uVar13 + 1;
                }
                else {
                  (iVar4._M_current)->value_ = local_54.value_;
                  (this->vertex_to_left_most_corner_map_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
                  uVar13 = uVar13 + 1;
                }
              }
              (this->corner_to_vertex_map_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_54.value_].value_ = uVar12;
              pCVar8 = this->corner_table_;
              if (local_54.value_ == 0xffffffff) break;
              if (local_54.value_ * -0x55555555 < 0x55555556) {
                uVar6 = local_54.value_ + 2;
                if (uVar6 == 0xffffffff) break;
              }
              else {
                uVar6 = local_54.value_ - 1;
              }
              uVar6 = (pCVar8->opposite_corners_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar6].value_;
              if (((uVar6 == 0xffffffff) ||
                  (local_54.value_ = ((uVar6 * -0x55555555 < 0x55555556) - 1 | 2) + uVar6,
                  local_54.value_ == 0xffffffff)) || (local_54.value_ == local_50.value_)) break;
            }
          }
        }
      }
LAB_00149022:
      uVar12 = uVar13;
      uVar10 = uVar10 + 1;
      pIVar7 = (pCVar8->vertex_corners_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < ((ulong)((long)(pCVar8->vertex_corners_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar7) >> 2
                      & 0xffffffff));
  }
  return true;
}

Assistant:

bool MeshAttributeCornerTable::RecomputeVerticesInternal(
    const Mesh *mesh, const PointAttribute *att) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  vertex_to_attribute_entry_id_map_.clear();
  vertex_to_left_most_corner_map_.clear();
  int num_new_vertices = 0;
  for (VertexIndex v(0); v < corner_table_->num_vertices(); ++v) {
    const CornerIndex c = corner_table_->LeftMostCorner(v);
    if (c == kInvalidCornerIndex) {
      continue;  // Isolated vertex?
    }
    AttributeValueIndex first_vert_id(num_new_vertices++);
    if (init_vertex_to_attribute_entry_map) {
      const PointIndex point_id = mesh->CornerToPointId(c.value());
      vertex_to_attribute_entry_id_map_.push_back(att->mapped_index(point_id));
    } else {
      // Identity mapping
      vertex_to_attribute_entry_id_map_.push_back(first_vert_id);
    }
    CornerIndex first_c = c;
    CornerIndex act_c;
    // Check if the vertex is on a seam edge, if it is we need to find the first
    // attribute entry on the seam edge when traversing in the CCW direction.
    if (is_vertex_on_seam_[v.value()]) {
      // Try to swing left on the modified corner table. We need to get the
      // first corner that defines an attribute seam.
      act_c = SwingLeft(first_c);
      while (act_c != kInvalidCornerIndex) {
        first_c = act_c;
        act_c = SwingLeft(act_c);
        if (act_c == c) {
          // We reached the initial corner which shouldn't happen when we swing
          // left from |c|.
          return false;
        }
      }
    }
    corner_to_vertex_map_[first_c.value()] = VertexIndex(first_vert_id.value());
    vertex_to_left_most_corner_map_.push_back(first_c);
    act_c = corner_table_->SwingRight(first_c);
    while (act_c != kInvalidCornerIndex && act_c != first_c) {
      if (IsCornerOppositeToSeamEdge(corner_table_->Next(act_c))) {
        first_vert_id = AttributeValueIndex(num_new_vertices++);
        if (init_vertex_to_attribute_entry_map) {
          const PointIndex point_id = mesh->CornerToPointId(act_c.value());
          vertex_to_attribute_entry_id_map_.push_back(
              att->mapped_index(point_id));
        } else {
          // Identity mapping.
          vertex_to_attribute_entry_id_map_.push_back(first_vert_id);
        }
        vertex_to_left_most_corner_map_.push_back(act_c);
      }
      corner_to_vertex_map_[act_c.value()] = VertexIndex(first_vert_id.value());
      act_c = corner_table_->SwingRight(act_c);
    }
  }
  return true;
}